

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateFunctionDefinition(ExpressionTranslateContext *ctx,ExprFunctionDefinition *expression)

{
  FunctionData *function;
  ScopeData *pSVar1;
  VariableData *variable;
  TypeClass *pTVar2;
  ExprBase *expression_00;
  bool bVar3;
  uint uVar4;
  VariableData **ppVVar5;
  ExprVariableDefinition *pEVar6;
  uint k;
  uint uVar7;
  char *format;
  IntrusiveList<ExprBase> *pIVar8;
  
  if (ctx->skipFunctionDefinitions != false) {
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,")");
    Print(ctx,"__nullcMakeFunction(__nullcFR[%d], 0)",(ulong)expression->function->functionIndex);
    return;
  }
  ctx->skipFunctionDefinitions = true;
  function = expression->function;
  pSVar1 = function->scope;
  if ((((pSVar1 == ctx->ctx->globalScope) || (pSVar1->ownerNamespace != (NamespaceData *)0x0)) ||
      (pSVar1->ownerType != (TypeBase *)0x0)) &&
     ((*(function->name->name).begin != '$' && (function->isHidden == false)))) {
    bVar3 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0013f352;
    }
    bVar3 = true;
    format = "template<int I> ";
  }
  else {
    format = "static ";
    bVar3 = false;
  }
  Print(ctx,format);
LAB_0013f352:
  TranslateTypeName(ctx,function->type->returnType);
  Print(ctx," ");
  TranslateFunctionName(ctx,function);
  Print(ctx,"(");
  pEVar6 = (expression->arguments).head;
  while (pEVar6 != (ExprVariableDefinition *)0x0) {
    TranslateTypeName(ctx,pEVar6->variable->variable->type);
    Print(ctx," ");
    TranslateVariableName(ctx,pEVar6->variable->variable);
    Print(ctx,", ");
    pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
    if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e)) {
      pEVar6 = (ExprVariableDefinition *)0x0;
    }
  }
  TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
  Print(ctx," ");
  TranslateVariableName(ctx,expression->contextArgument->variable->variable);
  Print(ctx,")");
  PrintLine(ctx);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  uVar7 = 0;
  do {
    if ((function->functionScope->allVariables).count <= uVar7) {
      if (function->type->returnType != ctx->ctx->typeVoid) {
        PrintIndent(ctx);
        TranslateTypeName(ctx,function->type->returnType);
        Print(ctx," __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
        PrintLine(ctx);
      }
      if (expression->coroutineStateRead != (ExprBase *)0x0) {
        PrintIndent(ctx);
        Print(ctx,"int __currJmpOffset = ");
        Translate(ctx,expression->coroutineStateRead);
        Print(ctx,";");
        PrintLine(ctx);
        for (uVar7 = 1; uVar7 - 1 < function->yieldCount; uVar7 = uVar7 + 1) {
          PrintIndentedLine(ctx,"if(__currJmpOffset == %d)",(ulong)uVar7);
          ctx->depth = ctx->depth + 1;
          PrintIndentedLine(ctx,"goto yield_%d;",(ulong)uVar7);
          ctx->depth = ctx->depth - 1;
        }
      }
      pIVar8 = &expression->expressions;
      while (expression_00 = pIVar8->head, expression_00 != (ExprBase *)0x0) {
        PrintIndent(ctx);
        Translate(ctx,expression_00);
        Print(ctx,";");
        PrintLine(ctx);
        pIVar8 = (IntrusiveList<ExprBase> *)&expression_00->next;
      }
      ctx->depth = ctx->depth - 1;
      PrintIndentedLine(ctx,"}");
      ctx->nextReturnValueId = ctx->nextReturnValueId + 1;
      if (bVar3) {
        Print(ctx,"template ");
        TranslateTypeName(ctx,function->type->returnType);
        Print(ctx," ");
        TranslateFunctionName(ctx,function);
        Print(ctx,"<0>(");
        pEVar6 = (expression->arguments).head;
        while (pEVar6 != (ExprVariableDefinition *)0x0) {
          TranslateTypeName(ctx,pEVar6->variable->variable->type);
          Print(ctx," ");
          TranslateVariableName(ctx,pEVar6->variable->variable);
          Print(ctx,", ");
          pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
          if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e)
             ) {
            pEVar6 = (ExprVariableDefinition *)0x0;
          }
        }
        TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
        Print(ctx," ");
        TranslateVariableName(ctx,expression->contextArgument->variable->variable);
        Print(ctx,");");
        PrintLine(ctx);
      }
      ctx->skipFunctionDefinitions = false;
      return;
    }
    ppVVar5 = SmallArray<VariableData_*,_4U>::operator[]
                        (&function->functionScope->allVariables,uVar7);
    variable = *ppVVar5;
    if ((variable->isVmAlloca == false) && (variable->lookupOnly == false)) {
      pEVar6 = (expression->arguments).head;
      while (pEVar6 != (ExprVariableDefinition *)0x0) {
        if (variable == pEVar6->variable->variable) goto LAB_0013f494;
        pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
        if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e))
        {
          pEVar6 = (ExprVariableDefinition *)0x0;
        }
      }
      if ((variable != expression->contextArgument->variable->variable) &&
         (variable->type != ctx->ctx->typeVoid)) {
        PrintIndent(ctx);
        pTVar2 = (TypeClass *)variable->type;
        if ((pTVar2 == (TypeClass *)0x0) ||
           ((pTVar2->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
          if ((pTVar2->super_TypeStruct).super_TypeBase.alignment != variable->alignment)
          goto LAB_0013f50b;
        }
        else {
          uVar4 = GetNaturalClassAlignment(pTVar2);
          if (uVar4 != variable->alignment) {
LAB_0013f50b:
            Print(ctx,"NULLC_ALIGN_MSVC(%d) ");
          }
        }
        TranslateTypeName(ctx,variable->type);
        pTVar2 = (TypeClass *)variable->type;
        if ((pTVar2 == (TypeClass *)0x0) ||
           ((pTVar2->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
          if ((pTVar2->super_TypeStruct).super_TypeBase.alignment != variable->alignment)
          goto LAB_0013f54f;
        }
        else {
          uVar4 = GetNaturalClassAlignment(pTVar2);
          if (uVar4 != variable->alignment) {
LAB_0013f54f:
            Print(ctx," NULLC_ALIGN_GCC(%d)");
          }
        }
        Print(ctx," ");
        TranslateVariableName(ctx,variable);
        Print(ctx,";");
        PrintLine(ctx);
      }
    }
LAB_0013f494:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TranslateFunctionDefinition(ExpressionTranslateContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.skipFunctionDefinitions)
	{
		// Skip nested definitions
		ctx.skipFunctionDefinitions = true;

		FunctionData *function = expression->function;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
		{
			TranslateTypeName(ctx, curr->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable->variable);
			Print(ctx, ", ");
		}

		TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
		Print(ctx, " ");
		TranslateVariableName(ctx, expression->contextArgument->variable->variable);

		Print(ctx, ")");
		PrintLine(ctx);
		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		for(unsigned k = 0; k < function->functionScope->allVariables.size(); k++)
		{
			VariableData *variable = function->functionScope->allVariables[k];

			// Don't need variables allocated by intermediate vm compilation
			if(variable->isVmAlloca)
				continue;

			if(variable->lookupOnly)
				continue;

			bool isArgument = false;

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				if(variable == curr->variable->variable)
				{
					isArgument = true;
					break;
				}
			}

			if(isArgument || variable == expression->contextArgument->variable->variable)
				continue;

			if(variable->type == ctx.ctx.typeVoid)
				continue;

			PrintIndent(ctx);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}

			TranslateTypeName(ctx, variable->type);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}

			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}

		if(function->type->returnType != ctx.ctx.typeVoid)
		{
			PrintIndent(ctx);
			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " __nullcReturnValue_%d;", ctx.nextReturnValueId);
			PrintLine(ctx);
		}

		if(expression->coroutineStateRead)
		{
			PrintIndent(ctx);
			Print(ctx, "int __currJmpOffset = ");
			Translate(ctx, expression->coroutineStateRead);
			Print(ctx, ";");
			PrintLine(ctx);

			for(unsigned i = 0; i < function->yieldCount; i++)
			{
				PrintIndentedLine(ctx, "if(__currJmpOffset == %d)", i + 1);

				ctx.depth++;

				PrintIndentedLine(ctx, "goto yield_%d;", i + 1);

				ctx.depth--;
			}
		}

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
		{
			PrintIndent(ctx);

			Translate(ctx, value);

			Print(ctx, ";");

			PrintLine(ctx);
		}


		ctx.depth--;

		PrintIndentedLine(ctx, "}");

		ctx.nextReturnValueId++;

		if(isGeneric)
		{
			Print(ctx, "template ");

			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " ");
			TranslateFunctionName(ctx, function);
			Print(ctx, "<0>(");

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				TranslateTypeName(ctx, curr->variable->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, expression->contextArgument->variable->variable);

			Print(ctx, ");");
			PrintLine(ctx);
		}

		ctx.skipFunctionDefinitions = false;
	}
	else
	{
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")");
		Print(ctx, "__nullcMakeFunction(__nullcFR[%d], 0)", expression->function->functionIndex);
	}
}